

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::ChElementShellReissner4::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChElementShellReissner4 *this,double U,double V)

{
  double dVar1;
  double dVar2;
  pointer psVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  psVar3 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar4 = psVar3[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar5 = (psVar3->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar6 = psVar3[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar7 = psVar3[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar22 = *(double *)((long)&peVar4->super_ChNodeFEAbase + 0x20);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar22;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)&peVar5->field_0x30;
  auVar18 = vmovddup_avx512vl(auVar18);
  dVar9 = (V + 1.0) * 0.25;
  dVar10 = (V + 1.0) * -0.25;
  dVar11 = (1.0 - V) * -0.25;
  dVar12 = (1.0 - V) * 0.25;
  dVar13 = (U + 1.0) * 0.25;
  dVar14 = (1.0 - U) * 0.25;
  dVar15 = (1.0 - U) * -0.25;
  dVar16 = (U + 1.0) * -0.25;
  dVar23 = *(double *)((long)&peVar5->super_ChNodeFEAbase + 0x20);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar23;
  auVar19 = vunpcklpd_avx512vl(auVar18,auVar30);
  dVar1 = *(double *)((long)&peVar6->super_ChNodeFEAbase + 0x20);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1;
  dVar2 = *(double *)((long)&peVar7->super_ChNodeFEAbase + 0x20);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar2;
  auVar24._0_8_ =
       *(double *)&peVar5->field_0x28 * dVar9 + *(double *)&peVar4->field_0x28 * dVar10 +
       dVar11 * *(double *)&peVar6->field_0x28 + dVar12 * *(double *)&peVar7->field_0x28;
  auVar24._8_8_ =
       *(double *)&peVar5->field_0x30 * dVar9 + *(double *)&peVar4->field_0x30 * dVar10 +
       dVar11 * *(double *)&peVar6->field_0x30 + dVar12 * *(double *)&peVar7->field_0x30;
  auVar31._8_8_ = *(undefined8 *)&peVar4->field_0x30;
  auVar31._0_8_ = *(undefined8 *)&peVar4->field_0x30;
  auVar28._8_8_ = *(undefined8 *)&peVar6->field_0x30;
  auVar28._0_8_ = *(undefined8 *)&peVar6->field_0x30;
  auVar30 = vunpcklpd_avx(auVar31,auVar33);
  auVar21 = vunpcklpd_avx(auVar28,auVar34);
  auVar29._8_8_ = *(undefined8 *)&peVar7->field_0x30;
  auVar29._0_8_ = *(undefined8 *)&peVar7->field_0x30;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar23 * dVar9 + dVar22 * dVar10 + dVar1 * dVar11 + dVar2 * dVar12;
  auVar18 = vshufpd_avx(auVar24,auVar32,1);
  auVar25 = vunpcklpd_avx(auVar29,auVar35);
  auVar20._0_8_ =
       dVar13 * auVar19._0_8_ + auVar30._0_8_ * dVar14 + dVar15 * auVar21._0_8_ +
       dVar16 * auVar25._0_8_;
  auVar20._8_8_ =
       dVar13 * auVar19._8_8_ + auVar30._8_8_ * dVar14 + dVar15 * auVar21._8_8_ +
       dVar16 * auVar25._8_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       *(double *)&peVar4->field_0x28 * dVar14 + dVar13 * *(double *)&peVar5->field_0x28 +
       dVar15 * *(double *)&peVar6->field_0x28 + dVar16 * *(double *)&peVar7->field_0x28;
  auVar30 = vunpcklpd_avx(auVar19,auVar20);
  auVar27._0_8_ = auVar30._0_8_ * auVar18._0_8_;
  auVar27._8_8_ = auVar30._8_8_ * auVar18._8_8_;
  auVar30 = vfmsub231pd_fma(auVar27,auVar24,auVar20);
  auVar18 = vshufpd_avx(auVar20,auVar20,1);
  auVar25._0_8_ = auVar30._0_8_ * auVar30._0_8_;
  auVar25._8_8_ = auVar30._8_8_ * auVar30._8_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar18._0_8_ * auVar24._0_8_;
  auVar21 = vfmsub231sd_fma(auVar21,auVar32,auVar19);
  auVar18 = vshufpd_avx(auVar25,auVar25,1);
  auVar18 = vfmadd231sd_fma(auVar18,auVar30,auVar30);
  auVar18 = vfmadd231sd_fma(auVar18,auVar21,auVar21);
  auVar18 = vsqrtsd_avx(auVar18,auVar18);
  dVar22 = auVar18._0_8_;
  dVar23 = 1.0 / dVar22;
  uVar17 = 0xff;
  if (dVar22 < 2.2250738585072014e-308) {
    uVar17 = 0;
  }
  auVar26._8_8_ = dVar23;
  auVar26._0_8_ = dVar23;
  auVar18 = vmulpd_avx512vl(auVar30,auVar26);
  bVar8 = (bool)((byte)uVar17 & 1);
  __return_storage_ptr__->m_data[0] =
       (double)((ulong)bVar8 * auVar18._0_8_ | (ulong)!bVar8 * 0x3ff0000000000000);
  __return_storage_ptr__->m_data[1] = (double)((ulong)((byte)(uVar17 >> 1) & 1) * auVar18._8_8_);
  __return_storage_ptr__->m_data[2] =
       (double)((ulong)(2.2250738585072014e-308 <= dVar22) * (long)(auVar21._0_8_ * dVar23));
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementShellReissner4::ComputeNormal(const double U, const double V) {
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeFunctionsDerivativeX(Nx, U, V);
    ShapeFunctionsDerivativeY(Ny, U, V);

    const ChVector<>& pA = m_nodes[0]->GetPos();
    const ChVector<>& pB = m_nodes[1]->GetPos();
    const ChVector<>& pC = m_nodes[2]->GetPos();
    const ChVector<>& pD = m_nodes[3]->GetPos();

    ChVector<> Gx = Nx(0) * pA + Nx(1) * pB + Nx(2) * pC + Nx(3) * pD;
    ChVector<> Gy = Ny(0) * pA + Ny(1) * pB + Ny(2) * pC + Ny(3) * pD;

    ChVector<> mnorm = Vcross(Gx, Gy);
    return mnorm.GetNormalized();
}